

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

void __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::~BinaryHeap(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
              *this)

{
  Constraint_Generator **ppCVar1;
  ulong uVar2;
  
  ppCVar1 = this->_data;
  if (ppCVar1 != (Constraint_Generator **)0x0) {
    uVar2 = (ulong)this->_capacity * 8 + 0xf & 0xffffffff0;
    if (uVar2 == 0) {
      *ppCVar1 = (Constraint_Generator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppCVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *ppCVar1 = (Constraint_Generator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppCVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *ppCVar1 = (Constraint_Generator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppCVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *ppCVar1 = (Constraint_Generator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppCVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *ppCVar1 = (Constraint_Generator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppCVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(ppCVar1,0x10);
      return;
    }
    *ppCVar1 = (Constraint_Generator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppCVar1;
  }
  return;
}

Assistant:

~BinaryHeap()
  {
    if(_data) {
      T* ep=_data+_size;
      while(ep!=_data1) {
	(--ep)->~T();
      }
      DEALLOC_KNOWN(_data,_capacity*sizeof(T),"BinaryHeap::T");
    }
  }